

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O3

void __thiscall foxxll::ufs_file_base::lock(ufs_file_base *this)

{
  lock((ufs_file_base *)((long)&this->_vptr_ufs_file_base + (long)this->_vptr_ufs_file_base[-10]));
  return;
}

Assistant:

void ufs_file_base::lock()
{
#if FOXXLL_WINDOWS || defined(__MINGW32__)
    // not yet implemented
#else
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);
    struct flock lock_struct;
    lock_struct.l_type = static_cast<short>(mode_ & RDONLY ? F_RDLCK : F_RDLCK | F_WRLCK);
    lock_struct.l_whence = SEEK_SET;
    lock_struct.l_start = 0;
    lock_struct.l_len = 0; // lock all bytes
    if ((::fcntl(file_des_, F_SETLK, &lock_struct)) < 0)
        FOXXLL_THROW_ERRNO(io_error, "fcntl(,F_SETLK,) path=" << filename_ << " fd=" << file_des_);
#endif
}